

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageDefinition
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location)

{
  bool bVar1;
  string *output;
  undefined1 local_38 [8];
  LocationRecorder location;
  LocationRecorder *message_location_local;
  DescriptorProto *message_local;
  Parser *this_local;
  
  location.location_ = (Location *)message_location;
  bVar1 = Consume(this,"message");
  if (bVar1) {
    LocationRecorder::LocationRecorder
              ((LocationRecorder *)local_38,(LocationRecorder *)location.location_,1);
    LocationRecorder::RecordLegacyLocation
              ((LocationRecorder *)local_38,&message->super_Message,NAME);
    output = DescriptorProto::mutable_name_abi_cxx11_(message);
    bVar1 = ConsumeIdentifier(this,output,"Expected message name.");
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_38);
    if (bVar1) {
      bVar1 = ParseMessageBlock(this,message,(LocationRecorder *)location.location_);
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseMessageDefinition(DescriptorProto* message,
                                    const LocationRecorder& message_location) {
  DO(Consume("message"));
  {
    LocationRecorder location(message_location,
                              DescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(
        message, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(message->mutable_name(), "Expected message name."));
  }
  DO(ParseMessageBlock(message, message_location));
  return true;
}